

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.hpp
# Opt level: O0

FunctionType * LLVMBC::cast<LLVMBC::FunctionType>(Type *type)

{
  undefined8 uVar1;
  TypeID TVar2;
  TypeID TVar3;
  void *pvVar4;
  char local_1018 [8];
  char buffer [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb;
  Type *type_local;
  
  TVar2 = Type::getTypeID(type);
  TVar3 = FunctionType::get_type_id();
  if (TVar2 != TVar3) {
    buffer._4088_8_ = dxil_spv::get_thread_log_callback();
    if ((LoggingCallback)buffer._4088_8_ == (LoggingCallback)0x0) {
      fprintf(_stderr,"[ERROR]: Invalid type ID in cast<T>.\n");
      fflush(_stderr);
    }
    else {
      snprintf(local_1018,0x1000,"Invalid type ID in cast<T>.\n");
      uVar1 = buffer._4088_8_;
      pvVar4 = dxil_spv::get_thread_log_callback_userdata();
      (*(code *)uVar1)(pvVar4,2,local_1018);
    }
    std::terminate();
  }
  return (FunctionType *)type;
}

Assistant:

inline T *cast(Type *type)
{
	if (type->getTypeID() != T::get_type_id())
	{
		LOGE("Invalid type ID in cast<T>.\n");
		std::terminate();
	}
	return static_cast<T *>(type);
}